

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O3

void LoadMapinfoACSLump(void)

{
  FOptionalMapinfoData *pFVar1;
  level_info_t *plVar2;
  Node *pNVar3;
  uint uVar4;
  int lumpnum;
  Node *pNVar5;
  
  plVar2 = level.info;
  uVar4 = FName::NameManager::FindName(&FName::NameData,"EData",false);
  pNVar3 = (plVar2->optdata).Nodes + ((plVar2->optdata).Size - 1 & uVar4);
  while( true ) {
    pNVar5 = pNVar3;
    if (pNVar5 == (Node *)0x0) {
      return;
    }
    if (pNVar5->Next == (Node *)0x1) break;
    pNVar3 = pNVar5->Next;
    if ((pNVar5->Pair).Key.Index == uVar4) {
      pFVar1 = (pNVar5->Pair).Value.Ptr;
      if ((pFVar1 != (FOptionalMapinfoData *)0x0) &&
         (lumpnum = FWadCollection::CheckNumForName(&Wads,(char *)pFVar1[1].Next,0), -1 < lumpnum))
      {
        FBehavior::StaticLoadModule(lumpnum,(FileReader *)0x0,0);
        return;
      }
      return;
    }
  }
  return;
}

Assistant:

void LoadMapinfoACSLump()
{
	FEDOptions *opt = level.info->GetOptData<FEDOptions>("EData", false);
	if (opt != NULL)
	{
		int lump = Wads.CheckNumForName(opt->acsName);
		if (lump >= 0) FBehavior::StaticLoadModule(lump);
	}
}